

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool __thiscall
cppcms::json::value::load(value *this,char **begin,char *end,bool full,int *line_number)

{
  char *pcVar1;
  bool bVar2;
  int err_line;
  charbuf b;
  int local_194;
  int *local_190;
  undefined **local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  istream local_148 [280];
  
  pcVar1 = *begin;
  local_190 = line_number;
  std::streambuf::streambuf((streambuf *)&local_188);
  local_188 = &PTR__streambuf_00113c18;
  local_180 = pcVar1;
  local_178 = pcVar1;
  local_170 = end;
  std::istream::istream(local_148,(streambuf *)&local_188);
  bVar2 = anon_unknown_9::parse_stream(local_148,this,full,&local_194);
  *begin = local_178;
  std::istream::~istream(local_148);
  std::streambuf::~streambuf(&local_188);
  if (local_190 != (int *)0x0 && !bVar2) {
    *local_190 = local_194;
  }
  return bVar2;
}

Assistant:

bool value::load(char const *&begin,char const *end,bool full,int *line_number)
	{
		int err_line;
		if(!parse_stream(begin,end,*this,full,err_line)) {
			if(line_number)
				*line_number=err_line;
			return false;
		}
		return true;

	}